

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  cmd_ln_t *config;
  char *pcVar6;
  FILE *pFVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  ps_decoder_t *ps;
  void *ptr;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  code *func;
  ulong uVar16;
  char **inputs;
  
  for (lVar12 = 2; lVar12 + -1 < (long)argc; lVar12 = lVar12 + 2) {
    pcVar11 = argv[lVar12 + -1];
    if (((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) && (*pcVar11 != '-')) {
      memmove(argv + lVar12 + -1,argv + lVar12,(long)(argc - (int)lVar12) << 3);
      argc = argc + -1;
      goto LAB_00107876;
    }
  }
  pcVar11 = "live";
LAB_00107876:
  lVar12 = 1;
  uVar14 = 0xffffffff;
  uVar16 = 0;
  inputs = (char **)0x0;
  iVar2 = argc;
LAB_00107885:
  iVar2 = iVar2 + -1;
  lVar12 = (long)(int)lVar12;
  do {
    if (argc <= (int)lVar12) {
      uVar15 = uVar14;
      for (uVar13 = 0; uVar16 >> 1 != uVar13; uVar13 = uVar13 + 1) {
        pcVar6 = inputs[uVar13];
        inputs[uVar13] = inputs[(int)uVar15];
        inputs[(int)uVar15] = pcVar6;
        uVar15 = uVar15 - 1;
      }
      uVar15 = (uint)uVar16;
      if ((((uVar15 == 0) && (iVar2 = strcmp(pcVar11,"soxflags"), iVar2 != 0)) &&
          ((iVar2 = strcmp(pcVar11,"config"), iVar2 != 0 &&
           (iVar2 = strcmp(pcVar11,"help-config"), iVar2 != 0)))) ||
         (config = cmd_ln_parse_r((ps_config_t *)0x0,ps_main_args_def,argc,argv,0),
         config == (cmd_ln_t *)0x0)) {
        usage(*argv,0);
        return 1;
      }
      ps_default_search_args(config);
      iVar2 = ps_config_bool(config,"state_align");
      if (iVar2 != 0) {
        ps_config_set_bool(config,"phone_align",1);
      }
      pcVar6 = ps_config_str(config,"config");
      if (pcVar6 != (char *)0x0) {
        pFVar7 = fopen(pcVar6,"rt");
        if (pFVar7 == (FILE *)0x0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                         ,0x305,"Failed to open config file %s",pcVar6);
          return 1;
        }
        fseek(pFVar7,0,2);
        sVar8 = ftell(pFVar7);
        fseek(pFVar7,0,0);
        pcVar9 = (char *)__ckd_malloc__(sVar8 + 1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                        ,0x30b);
        sVar10 = fread(pcVar9,1,sVar8,pFVar7);
        if (sVar10 != sVar8) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                         ,0x30d,"Failed to read config file %s",pcVar6);
          ckd_free(pcVar9);
          fclose(pFVar7);
          return 1;
        }
        pcVar9[sVar8] = '\0';
        fclose(pFVar7);
        config = ps_config_parse_json(config,pcVar9);
        ckd_free(pcVar9);
        if (config == (ps_config_t *)0x0) {
          return 1;
        }
        ps_config_set_str(config,"config",(char *)0x0);
      }
      iVar2 = strcmp(pcVar11,"soxflags");
      if (iVar2 == 0) {
        ps_expand_model_config(config);
        uVar16 = ps_config_int(config,"samprate");
        iVar2 = snprintf((char *)0x0,0,"-r %d -c 1 -b 16 -e signed-integer -t raw -",
                         uVar16 & 0xffffffff);
        if (-1 < iVar2) {
          pcVar11 = (char *)__ckd_calloc__((ulong)(iVar2 + 1),1,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                           ,0x264);
          iVar4 = 0;
          iVar3 = snprintf(pcVar11,(ulong)(iVar2 + 1),"-r %d -c 1 -b 16 -e signed-integer -t raw -",
                           uVar16 & 0xffffffff);
          if (iVar3 == iVar2) {
            puts(pcVar11);
            fflush(_stdout);
            ckd_free(pcVar11);
          }
          else {
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                           ,0x267,"Failed to snprintf()");
            iVar4 = -1;
          }
          goto LAB_00107cf1;
        }
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                       ,0x260,"Failed to snprintf()");
      }
      else {
        iVar2 = strcmp(pcVar11,"config");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar11,"live");
          if (iVar2 == 0) {
            func = live;
          }
          else {
            iVar2 = strcmp(pcVar11,"single");
            if (iVar2 != 0) {
              iVar2 = strcmp(pcVar11,"align");
              if (iVar2 != 0) {
                iVar2 = strcmp(pcVar11,"help");
                if (iVar2 == 0) {
                  iVar4 = 0;
                  usage(*argv,0);
                  goto LAB_00107cf1;
                }
                iVar2 = strcmp(pcVar11,"help-config");
                if (iVar2 != 0) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                          ,0x32d,"Unknown command \"%s\"\n",pcVar11);
                  return 1;
                }
                usage(*argv,1);
                goto LAB_00107c85;
              }
              if (1 < uVar15) {
                ps_config_set_bool(config,"bestpath",0);
                ps_config_set_str(config,"lm",(char *)0x0);
                pcVar11 = *inputs;
                if ((*pcVar11 == '-') && (pcVar11[1] == '\0')) {
                  bVar1 = true;
                  pFVar7 = _stdin;
                }
                else {
                  pFVar7 = fopen(pcVar11,"rb");
                  iVar4 = 0;
                  pcVar11 = *inputs;
                  if (pFVar7 == (FILE *)0x0) {
                    err_msg_system(ERR_ERROR,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                   ,0x21e,"Failed to open %s for input");
                    goto LAB_00107cf1;
                  }
                  bVar1 = false;
                }
                iVar4 = ps_config_soundfile(config,(FILE *)pFVar7,pcVar11);
                if (iVar4 < 0) {
                  ps = (ps_decoder_t *)0x0;
                  pcVar11 = (char *)0x0;
                }
                else {
                  ps = ps_init(config);
                  if (ps == (ps_decoder_t *)0x0) {
                    err_msg(ERR_FATAL,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                            ,0x224,"PocketSphinx decoder init failed\n");
                    exit(1);
                  }
                  ptr = __ckd_malloc__((ulong)(uVar15 - 1) << 2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                       ,0x1fa);
                  iVar2 = 0;
                  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                    sVar8 = strlen(inputs[uVar16 + 1]);
                    *(int *)((long)ptr + uVar16 * 4) = (int)sVar8;
                    iVar2 = iVar2 + (int)sVar8 + 1;
                  }
                  pcVar11 = (char *)__ckd_malloc__((long)iVar2,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                                  ,0x1ff);
                  pcVar6 = pcVar11;
                  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                    memcpy(pcVar6,inputs[uVar16 + 1],(long)*(int *)((long)ptr + uVar16 * 4));
                    pcVar9 = pcVar6 + *(int *)((long)ptr + uVar16 * 4);
                    pcVar6 = pcVar9 + 1;
                    *pcVar9 = ' ';
                  }
                  pcVar6[-1] = '\0';
                  ckd_free(ptr);
                  iVar4 = ps_set_align_text(ps,pcVar11);
                  if (-1 < iVar4) {
                    iVar4 = decode_single(ps,(FILE *)pFVar7);
                  }
                }
                if (!bVar1 && pFVar7 != (FILE *)0x0) {
                  fclose(pFVar7);
                }
                if (pcVar11 != (char *)0x0) {
                  ckd_free(pcVar11);
                }
                if (ps != (ps_decoder_t *)0x0) {
                  ps_free(ps);
                }
                goto LAB_00107cf1;
              }
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                      ,0x213,"Usage: pocketsphinx align INFILE TEXT...\n");
              goto LAB_00107caf;
            }
            func = single;
          }
          iVar4 = process_inputs(func,config,inputs,uVar15);
          goto LAB_00107cf1;
        }
        pcVar11 = ps_config_serialize_json(config);
        iVar2 = puts(pcVar11);
        if (-1 < iVar2) {
          fflush(_stdout);
LAB_00107c85:
          iVar4 = 0;
          goto LAB_00107cf1;
        }
      }
LAB_00107caf:
      iVar4 = -1;
LAB_00107cf1:
      ps_config_free(config);
      return iVar4;
    }
    pcVar6 = argv[lVar12];
    if (((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) && ((*pcVar6 != '-' || (pcVar6[1] == '\0'))))
    break;
    lVar12 = lVar12 + 2;
  } while( true );
  memmove(argv + lVar12,argv + lVar12 + 1,(long)(iVar2 - (int)lVar12) << 3);
  lVar5 = (long)argc;
  argc = argc + -1;
  inputs = argv + lVar5 + -1;
  *inputs = pcVar6;
  uVar16 = uVar16 + 1;
  uVar14 = uVar14 + 1;
  goto LAB_00107885;
}

Assistant:

int
main(int argc, char *argv[])
{
    ps_config_t *config;
    const char *conffile;
    char *command;
    char **inputs;
    int rv, ninputs;

    command = find_command(&argc, argv);
    inputs = find_inputs(&argc, argv, &ninputs);
    /* Only soxflags and config take no arguments */
    if (ninputs == 0) {
        if ((0 != strcmp(command, "soxflags"))
            && 0 != strcmp(command, "config")
            && 0 != strcmp(command, "help-config")) {
            usage(argv[0], FALSE);
            return 1;
        }
    }
    /* If arg parsing fails */
    if ((config = ps_config_parse_args(ps_main_args_def, argc, argv)) == NULL) {
        usage(argv[0], FALSE);
        return 1;
    }
    ps_default_search_args(config);
    if (ps_config_bool(config, "state_align"))
        ps_config_set_bool(config, "phone_align", TRUE);
    if ((conffile = ps_config_str(config, "config")) != NULL) {
        char *json;
        FILE *infh;
        size_t len;
        if ((infh = fopen(conffile, "rt")) == NULL) {
            E_ERROR_SYSTEM("Failed to open config file %s", conffile);
            return 1;
        }
        fseek(infh, 0, SEEK_END);
        len = (size_t)ftell(infh);
        fseek(infh, 0, SEEK_SET);
        json = ckd_malloc(len + 1);
        if (fread(json, 1, len, infh) != len) {
            E_ERROR_SYSTEM("Failed to read config file %s", conffile);
            ckd_free(json);
            fclose(infh);
            return 1;
        }
        json[len] = '\0';
        fclose(infh);
        config = ps_config_parse_json(config, json);
        ckd_free(json);
        if (config == NULL)
            return 1;
        ps_config_set_str(config, "config", NULL);
    }
    if (0 == strcmp(command, "soxflags"))
        rv = soxflags(config);
    else if (0 == strcmp(command, "config"))
        rv = print_config(config);
    else if (0 == strcmp(command, "live"))
        rv = process_inputs(live, config, inputs, ninputs);
    else if (0 == strcmp(command, "single"))
        rv = process_inputs(single, config, inputs, ninputs);
    else if (0 == strcmp(command, "align"))
        rv = align(config, inputs, ninputs);
    else if (0 == strcmp(command, "help")) {
        rv = 0;
        usage(argv[0], FALSE);
    }
    else if (0 == strcmp(command, "help-config")) {
        rv = 0;
        usage(argv[0], TRUE);
    }
    else {
        E_ERROR("Unknown command \"%s\"\n", command);
        return 1;
    }

    ps_config_free(config);
    return rv;
}